

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Builder * __thiscall
capnproto_test::capnp::test::TestDefaults::Builder::getVoidList
          (Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder builder;
  uint ptrIndex;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  ptrIndex = ::capnp::bounded<3u>();
  ::capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,ptrIndex);
  builder.capTable = local_28.capTable;
  builder.segment = local_28.segment;
  builder.pointer = local_28.pointer;
  ::capnp::_::PointerHelpers<capnp::List<capnp::Void,_(capnp::Kind)0>,_(capnp::Kind)6>::get
            (__return_storage_ptr__,builder,(word *)&DAT_00a14170);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnp::Void,  ::capnp::Kind::PRIMITIVE>::Builder TestDefaults::Builder::getVoidList() {
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::Void,  ::capnp::Kind::PRIMITIVE>>::get(_builder.getPointerField(
      ::capnp::bounded<3>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 631);
}